

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::ComputeTargetBuildOrder
          (cmGlobalGhsMultiGenerator *this,cmGeneratorTarget *tgt,
          vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *build)

{
  bool bVar1;
  initializer_list<const_cmGeneratorTarget_*> __l;
  allocator_type local_39;
  cmGeneratorTarget *local_38;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> t;
  
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = tgt;
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            (&t,__l,&local_39);
  bVar1 = ComputeTargetBuildOrder(this,&t,build);
  std::_Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
  ~_Vector_base(&t.
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               );
  return bVar1;
}

Assistant:

bool cmGlobalGhsMultiGenerator::ComputeTargetBuildOrder(
  cmGeneratorTarget const* tgt, std::vector<cmGeneratorTarget const*>& build)
{
  std::vector<cmGeneratorTarget const*> t{ tgt };
  return this->ComputeTargetBuildOrder(t, build);
}